

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O0

wchar_t archive_entry_xattr_next(archive_entry *entry,char **name,void **value,size_t *size)

{
  size_t *size_local;
  void **value_local;
  char **name_local;
  archive_entry *entry_local;
  
  if (entry->xattr_p == (ae_xattr *)0x0) {
    *name = (char *)0x0;
    *value = (void *)0x0;
    *size = 0;
    entry_local._4_4_ = L'\xffffffec';
  }
  else {
    *name = entry->xattr_p->name;
    *value = entry->xattr_p->value;
    *size = entry->xattr_p->size;
    entry->xattr_p = entry->xattr_p->next;
    entry_local._4_4_ = L'\0';
  }
  return entry_local._4_4_;
}

Assistant:

int
archive_entry_xattr_next(struct archive_entry * entry,
	const char **name, const void **value, size_t *size)
{
	if (entry->xattr_p) {
		*name = entry->xattr_p->name;
		*value = entry->xattr_p->value;
		*size = entry->xattr_p->size;

		entry->xattr_p = entry->xattr_p->next;

		return (ARCHIVE_OK);
	} else {
		*name = NULL;
		*value = NULL;
		*size = (size_t)0;
		return (ARCHIVE_WARN);
	}
}